

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplePursuit.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_51d71::MpPursuer::update(MpPursuer *this,float currentTime,float elapsedTime)

{
  Vec3 *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  Vec3 VVar4;
  float maxTime;
  float r;
  float d;
  float in_stack_000000d4;
  AbstractVehicle *in_stack_000000d8;
  SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
  *in_stack_000000e0;
  float in_stack_00000104;
  Vec3 *in_stack_00000108;
  SimpleVehicle *in_stack_00000110;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  float fStack_74;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa4;
  
  (**(code **)(*(long *)in_RDI + 0x40))();
  (**(code **)(**(long **)&in_RDI[0x14].z + 0x40))();
  fVar1 = OpenSteer::Vec3::distance
                    ((Vec3 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_RDI);
  fVar2 = (float)(**(code **)(*(long *)in_RDI + 0xc0))();
  fVar3 = (float)(**(code **)(**(long **)&in_RDI[0x14].z + 0xc0))();
  if (fVar1 < fVar2 + fVar3) {
    reset((MpPursuer *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
  }
  VVar4 = OpenSteer::
          SteerLibraryMixin<OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>_>
          ::steerForPursuit(in_stack_000000e0,in_stack_000000d8,in_stack_000000d4);
  fVar2 = VVar4.z;
  fStack_74 = VVar4.y;
  fVar1 = fVar2;
  OpenSteer::SimpleVehicle::applySteeringForce
            (in_stack_00000110,in_stack_00000108,in_stack_00000104);
  (**(code **)(*(long *)in_RDI + 0x40))();
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  recordTrailVertex((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)
                    CONCAT44(in_stack_ffffffffffffffa4,fVar1),fStack_74,
                    (Vec3 *)CONCAT44(in_stack_ffffffffffffff94,fVar2));
  return;
}

Assistant:

void update (const float currentTime, const float elapsedTime)
        {
            // when pursuer touches quarry ("wanderer"), reset its position
            const float d = Vec3::distance (position(), wanderer->position());
            const float r = radius() + wanderer->radius();
            if (d < r) reset ();

            const float maxTime = 20; // xxx hard-to-justify value
            applySteeringForce (steerForPursuit (*wanderer, maxTime), elapsedTime);

            // for annotation
            recordTrailVertex (currentTime, position());
        }